

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Mode __thiscall
Catch::Clara::Parser::handlePositional
          (Parser *this,size_t i,char c,string *arg,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  Mode MVar1;
  long lVar2;
  bool bVar3;
  undefined2 *local_a0;
  undefined8 local_98;
  undefined2 local_90 [8];
  undefined1 *local_80;
  string data;
  char *local_58 [2];
  char local_48 [16];
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *local_38;
  
  bVar3 = true;
  local_38 = tokens;
  if (this->inQuotes == false) {
    local_a0 = local_90;
    local_90[0] = 0;
    local_98 = 1;
    lVar2 = std::__cxx11::string::find((char)&local_a0,(ulong)(uint)(int)c);
    bVar3 = lVar2 == -1;
    if (local_a0 != local_90) {
      operator_delete(local_a0);
    }
  }
  if (bVar3) {
    MVar1 = this->mode;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_80,(ulong)arg);
    data.field_2._8_4_ = 0;
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,local_80,data._M_dataplus._M_p + (long)local_80);
    std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
    emplace_back<Catch::Clara::Parser::Token>(local_38,(Token *)((long)&data.field_2 + 8));
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
    if ((size_type *)local_80 != &data._M_string_length) {
      operator_delete(local_80);
    }
    MVar1 = None;
  }
  return MVar1;
}

Assistant:

Mode handlePositional(std::size_t i, char c, std::string const& arg, std::vector<Token>& tokens) {
			if (inQuotes || std::string("\0", 1).find(c) == std::string::npos)
				return mode;

			std::string data = arg.substr(from, i - from);
			tokens.push_back(Token(Token::Positional, data));
			return None;
		}